

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

_Bool run_container_iterate(run_container_t *cont,uint32_t base,roaring_iterator iterator,void *ptr)

{
  ushort uVar1;
  ushort uVar2;
  ulong uVar3;
  undefined8 in_RCX;
  code *in_RDX;
  int in_ESI;
  int *in_RDI;
  int j;
  uint16_t le;
  uint32_t run_start;
  int i;
  int local_38;
  int local_2c;
  
  local_2c = 0;
  do {
    if (*in_RDI <= local_2c) {
      return true;
    }
    uVar1 = *(ushort *)(*(long *)(in_RDI + 2) + (long)local_2c * 4);
    uVar2 = *(ushort *)(*(long *)(in_RDI + 2) + 2 + (long)local_2c * 4);
    for (local_38 = 0; local_38 <= (int)(uint)uVar2; local_38 = local_38 + 1) {
      uVar3 = (*in_RDX)(in_ESI + (uint)uVar1 + local_38,in_RCX);
      if ((uVar3 & 1) == 0) {
        return false;
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

bool run_container_iterate(const run_container_t *cont, uint32_t base,
                           roaring_iterator iterator, void *ptr) {
    for (int i = 0; i < cont->n_runs; ++i) {
        uint32_t run_start = base + cont->runs[i].value;
        uint16_t le = cont->runs[i].length;

        for (int j = 0; j <= le; ++j)
            if (!iterator(run_start + j, ptr)) return false;
    }
    return true;
}